

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O2

void __thiscall Day::print(Day *this)

{
  pointer pLVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"day: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  for (uVar3 = 0;
      pLVar1 = (this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0xa8);
      uVar3 = uVar3 + 1) {
    Lesson::print((Lesson *)((long)&pLVar1->lesson_id + lVar4));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar4 = lVar4 + 0xa8;
  }
  return;
}

Assistant:

void Day::print() {
    std::cout << "day: " << name << std::endl;
    for (size_t i = 0; i < lessons.size(); i++) {
        lessons[i].print();
        std::cout << std::endl;
    }
}